

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXFTypes.cpp
# Opt level: O3

TLVReader * __thiscall
ASDCP::MXF::TLVReader::ReadObject(TLVReader *this,MDDEntry *Entry,IArchive *Object)

{
  bool bVar1;
  char cVar2;
  long *in_RCX;
  undefined1 *puVar3;
  
  if (in_RCX == (long *)0x0) {
    puVar3 = Kumu::RESULT_PTR;
  }
  else {
    bVar1 = FindTL((TLVReader *)Entry,(MDDEntry *)Object);
    if ((bVar1) && (*(uint *)(Entry->ul + 0xc) < *(uint *)(Entry->ul + 8))) {
      cVar2 = (**(code **)(*in_RCX + 0x28))();
      if (cVar2 == '\0') {
        Kumu::Result_t::operator()((int *)this,Kumu::RESULT_FALSE);
        return this;
      }
      puVar3 = (undefined1 *)&Kumu::RESULT_OK;
    }
    else {
      puVar3 = Kumu::RESULT_FALSE;
    }
  }
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)puVar3);
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::MXF::TLVReader::ReadObject(const MDDEntry& Entry, Kumu::IArchive* Object)
{
  ASDCP_TEST_NULL(Object);

  if ( FindTL(Entry) )
    {
      if ( m_size < m_capacity ) // don't try to unarchive an empty item
	{
	  // TODO: carry on if uachive fails
	  return Object->Unarchive(this) ? RESULT_OK : RESULT_FALSE(__LINE__, __FILE__);
	}
    }

  return RESULT_FALSE;
}